

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNHairBuilderSAH<8,_embree::CurveNv<8>,_embree::LineMi<8>,_embree::PointMi<8>_>::
build(BVHNHairBuilderSAH<8,_embree::CurveNv<8>,_embree::LineMi<8>,_embree::PointMi<8>_> *this)

{
  mvector<PrimRef> *prims;
  undefined8 *puVar1;
  undefined8 *puVar2;
  BVHN<8> *this_00;
  Scene *pSVar3;
  PrimRef *pPVar4;
  MemoryMonitorInterface *pMVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [24];
  long *plVar10;
  PrimRef *pPVar11;
  ulong uVar12;
  NodeRefPtr<8> root;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  ulong numPrimRefs;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  anon_class_8_1_8991fb9c reportFinishedRange;
  anon_class_8_1_8991fb9c createLeaf;
  PrimInfo pinfo;
  Set local_1c4;
  Create local_1c3;
  Set local_1c2;
  Create local_1c1;
  size_t *local_1c0;
  Settings *local_1b8;
  double local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  CreateAlloc local_190;
  anon_class_8_1_8991fb9c local_188;
  anon_class_8_1_8991fb9c local_180;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  long local_138;
  long lStack_130;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long local_e8;
  long lStack_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paStack_b8;
  size_t sStack_b0;
  PrimRef *local_a8;
  CreateAlloc *pCStack_a0;
  Create *local_98;
  Set *local_90;
  Create *local_88;
  Set *local_80;
  anon_class_8_1_8991fb9c *local_78;
  BuildProgressMonitorInterface *local_70;
  anon_class_8_1_8991fb9c *local_68;
  PrimRef *local_60;
  Scene *local_58;
  PrimRef *local_50;
  Scene *local_48;
  PrimRef *local_40;
  
  if ((this->settings).finished_range_threshold != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x20);
  }
  this_00 = this->bvh;
  pSVar3 = this->scene;
  numPrimRefs = (pSVar3->world).numBezierCurves + (pSVar3->world).numLineSegments +
                (pSVar3->world).numPoints;
  if (numPrimRefs == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    sVar16 = (this->prims).size_alloced;
    pPVar4 = (this->prims).items;
    if (pPVar4 != (PrimRef *)0x0) {
      if (sVar16 << 5 < 0x1c00000) {
        alignedFree(pPVar4);
      }
      else {
        os_free(pPVar4,sVar16 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar16 != 0) {
      pMVar5 = (this->prims).alloc.device;
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar16 * -0x20,1);
    }
    (this->prims).size_active = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
    return;
  }
  local_128._0_8_ = &local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x01');
  *(undefined1 *)local_128._0_8_ = 0x38;
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x1fb0eed);
  paVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(plVar10 + 2);
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar10 == paVar13) {
    local_168._0_8_ = *(undefined8 *)paVar13;
    local_168._8_8_ = plVar10[3];
    local_178._0_8_ = &local_168;
  }
  else {
    local_168._0_8_ = *(undefined8 *)paVar13;
    local_178._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)*plVar10;
  }
  local_178._8_8_ = plVar10[1];
  *plVar10 = (long)paVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar14) {
    aStack_c8._M_allocated_capacity = paVar14->_M_allocated_capacity;
    aStack_c8._8_8_ = plVar10[3];
    local_d8._0_8_ = &aStack_c8;
  }
  else {
    aStack_c8._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar10;
  }
  local_d8._8_8_ = plVar10[1];
  *plVar10 = (long)paVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1b0 = BVHN<8>::preBuild(this_00,(string *)&local_d8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &aStack_c8) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_178._0_8_ != &local_168) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_);
  }
  uVar12 = (this->prims).size_alloced;
  uVar18 = uVar12;
  if ((uVar12 < numPrimRefs) && (uVar18 = numPrimRefs, uVar17 = uVar12, uVar12 != 0)) {
    do {
      uVar18 = uVar17 * 2 + (ulong)(uVar17 * 2 == 0);
      uVar17 = uVar18;
    } while (uVar18 < numPrimRefs);
  }
  local_1c0 = &(this->prims).size_active;
  if (numPrimRefs < (this->prims).size_active) {
    *local_1c0 = numPrimRefs;
  }
  local_1b8 = &this->settings;
  prims = &this->prims;
  if (uVar12 == uVar18) {
    *local_1c0 = numPrimRefs;
    goto LAB_01268e74;
  }
  pMVar5 = (this->prims).alloc.device;
  pPVar4 = (this->prims).items;
  uVar12 = uVar18 << 5;
  (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,uVar12,0);
  if (uVar12 < 0x1c00000) {
    pPVar11 = (PrimRef *)alignedMalloc(uVar12,0x20);
  }
  else {
    pPVar11 = (PrimRef *)os_malloc(uVar12,&(this->prims).alloc.hugepages);
  }
  (this->prims).items = pPVar11;
  if ((this->prims).size_active == 0) {
    sVar16 = (this->prims).size_alloced;
    if (pPVar4 != (PrimRef *)0x0) goto LAB_01268e24;
  }
  else {
    lVar15 = 0;
    uVar12 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pPVar4->lower).field_0 + lVar15);
      uVar6 = puVar1[1];
      uVar7 = puVar1[2];
      uVar8 = puVar1[3];
      puVar2 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar15);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      puVar2[2] = uVar7;
      puVar2[3] = uVar8;
      uVar12 = uVar12 + 1;
      lVar15 = lVar15 + 0x20;
    } while (uVar12 < (this->prims).size_active);
    sVar16 = (this->prims).size_alloced;
LAB_01268e24:
    if (sVar16 << 5 < 0x1c00000) {
      alignedFree(pPVar4);
    }
    else {
      os_free(pPVar4,sVar16 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar16 != 0) {
    pMVar5 = (prims->alloc).device;
    (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,sVar16 * -0x20,1);
  }
  (this->prims).size_active = numPrimRefs;
  (this->prims).size_alloced = uVar18;
LAB_01268e74:
  avx::createPrimRefArray
            ((PrimInfo *)&local_128.field_1,this->scene,MTY_CURVES,false,numPrimRefs,prims,
             &(this->scene->progressInterface).super_BuildProgressMonitor);
  uVar12 = lStack_e0 - local_e8;
  uVar18 = (ulong)((uint)uVar12 & 7);
  lVar15 = uVar18 * 0x59 + 0x16;
  if (uVar18 == 0) {
    lVar15 = 0;
  }
  FastAllocator::init_estimate
            (&this->bvh->alloc,(uVar12 >> 3) * 0x2de + (uVar12 * 0x1c0 >> 5) + lVar15);
  (this->settings).branchingFactor = 8;
  (this->settings).maxDepth = 0x28;
  for (sVar16 = 0; (8UL >> sVar16 & 1) == 0; sVar16 = sVar16 + 1) {
  }
  (this->settings).logBlockSize = sVar16;
  (this->settings).minLeafSize = 8;
  (this->settings).maxLeafSize = 8;
  uVar12 = 0xffffffffffffffff;
  if (999999 < numPrimRefs) {
    uVar12 = numPrimRefs / 1000;
  }
  (this->settings).finished_range_threshold = uVar12;
  local_78 = &local_180;
  local_68 = &local_188;
  local_190.super_Create.allocator = (Create)&this->bvh->alloc;
  pCStack_a0 = &local_190;
  local_58 = this->scene;
  local_a8 = (this->prims).items;
  local_70 = &local_58->progressInterface;
  local_d8._0_8_ = local_1b8->branchingFactor;
  local_d8._8_8_ = local_1b8->maxDepth;
  aStack_c8._M_allocated_capacity = local_1b8->logBlockSize;
  aStack_c8._8_8_ = local_1b8->minLeafSize;
  paStack_b8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1b8->maxLeafSize;
  sStack_b0 = local_1b8->finished_range_threshold;
  local_98 = &local_1c1;
  local_90 = &local_1c2;
  local_88 = &local_1c3;
  local_80 = &local_1c4;
  local_178._0_8_ = local_128._0_8_;
  local_178._8_8_ = local_128._8_8_;
  local_168._0_8_ = local_118._0_8_;
  local_168._8_8_ = local_118._8_8_;
  local_158 = local_108;
  uStack_150 = uStack_100;
  local_148 = local_f8;
  uStack_140 = uStack_f0;
  local_138 = local_e8;
  lStack_130 = lStack_e0;
  local_198 = 0;
  local_1a8._8_8_ = SUB168(ZEXT816(0),4);
  auVar9 = ZEXT824((ulong)local_1a8._8_8_);
  local_1a8 = ZEXT816(0) << 0x20;
  local_188.this = this;
  local_180.this = this;
  local_60 = local_a8;
  local_50 = local_a8;
  local_48 = local_58;
  local_40 = local_a8;
  root = BVHBuilderHair::
         BuilderT<embree::NodeRefPtr<8>,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set,_embree::OBBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::OBBNode_t<embree::NodeRefPtr<8>,_8>::Set,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair.cpp:68:27),_embree::Scene::BuildProgressMonitorInterface,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair.cpp:82:36)>
         ::recurse((BuilderT<embree::NodeRefPtr<8>,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Set,_embree::OBBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::OBBNode_t<embree::NodeRefPtr<8>,_8>::Set,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_cpp:68:27),_embree::Scene::BuildProgressMonitorInterface,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_cpp:82:36)>
                    *)&local_d8.field_1,1,(PrimInfoRange *)&local_178.field_1,
                   (Allocator)(auVar9 << 0x40),true,false);
  local_d8._0_8_ = local_128._0_8_;
  local_d8._8_8_ = local_128._8_8_;
  aStack_c8._M_allocated_capacity = local_118._0_8_;
  aStack_c8._8_8_ = local_118._8_8_;
  paStack_b8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_128._0_8_;
  sStack_b0 = local_128._8_8_;
  local_a8 = (PrimRef *)local_118._0_8_;
  pCStack_a0 = (CreateAlloc *)local_118._8_8_;
  BVHN<8>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_d8.field_1,lStack_e0 - local_e8);
  if ((this->settings).finished_range_threshold != 0xffffffffffffffff) {
    root.ptr = (size_t)prims;
    FastAllocator::share(&this->bvh->alloc,prims);
  }
  if ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
    sVar16 = (this->prims).size_alloced;
    pPVar4 = (this->prims).items;
    if (pPVar4 != (PrimRef *)0x0) {
      root.ptr = sVar16 << 5;
      if (root.ptr < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar4);
      }
      else {
        os_free(pPVar4,root.ptr,(this->prims).alloc.hugepages);
      }
    }
    if (sVar16 != 0) {
      pMVar5 = (prims->alloc).device;
      root.ptr = sVar16 * -0x20;
      (**pMVar5->_vptr_MemoryMonitorInterface)(pMVar5,root.ptr,1);
    }
    *local_1c0 = 0;
    local_1c0[1] = 0;
    local_1c0[2] = 0;
  }
  BVHN<8>::cleanup(this->bvh,(EVP_PKEY_CTX *)root.ptr);
  BVHN<8>::postBuild(this->bvh,local_1b0);
  return;
}

Assistant:

void build() 
      {
        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.unshare(prims);

        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,false);
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairBuilderSAH");

        /* create primref array */
        prims.resize(numPrimitives);
        const PrimInfo pinfo = createPrimRefArray(scene,Geometry::MTY_CURVES,false,numPrimitives,prims,scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.size()*sizeof(typename BVH::OBBNode)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.size());
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
        
        /* builder settings */
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();
        settings.finished_range_threshold = numPrimitives/1000;
        if (settings.finished_range_threshold < 1000)
          settings.finished_range_threshold = inf;

        /* creates a leaf node */
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& set, const FastAllocator::CachedAllocator& alloc) -> NodeRef {
          
          if (set.size() == 0)
            return BVH::emptyNode;

          const unsigned int geomID0 = prims[set.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeaf(bvh,prims,set,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeaf(bvh,prims,set,alloc);
          else
            return CurvePrimitive::createLeaf(bvh,prims,set,alloc);
        };
        
        auto reportFinishedRange = [&] (const range<size_t>& range) -> void
          {
            PrimRef* begin = prims.data()+range.begin();
            PrimRef* end   = prims.data()+range.end(); // FIXME: extended end for spatial split builder!!!!!
            size_t bytes = (size_t)end - (size_t)begin;
            bvh->alloc.addBlock(begin,bytes);
          };
          
        /* build hierarchy */
        typename BVH::NodeRef root = BVHBuilderHair::build<NodeRef>
          (typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNode::Create(),
           typename BVH::AABBNode::Set(),
           typename BVH::OBBNode::Create(),
           typename BVH::OBBNode::Set(),
           createLeaf,scene->progressInterface,
           reportFinishedRange,
           scene,prims.data(),pinfo,settings);
        
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        
        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.finished_range_threshold != size_t(inf))
          bvh->alloc.share(prims);
        
        /* clear temporary data for static geometry */
        if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }